

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_32UL>_>
::expand_if_needed_(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_32UL>_>
                    *this,uint64_t *node_id)

{
  bool bVar1;
  node_map *this_00;
  uint64_t *in_RSI;
  uint64_t in_RDI;
  node_map node_map;
  node_map *in_stack_00000098;
  compact_bonsai_nlm<int,_32UL> *in_stack_000000a0;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_00000138;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_ffffffffffffff80;
  node_map *in_stack_ffffffffffffff90;
  
  bVar1 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::needs_to_expand
                    (in_stack_ffffffffffffff80);
  if (bVar1) {
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::expand(in_stack_00000138);
    this_00 = (node_map *)
              plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::operator[]
                        (in_stack_ffffffffffffff90,in_RDI);
    *in_RSI = (uint64_t)this_00;
    compact_bonsai_nlm<int,32ul>::
    expand<poplar::plain_bonsai_trie<90u,poplar::hash::vigna_hasher>::node_map>
              (in_stack_000000a0,in_stack_00000098);
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::~node_map(this_00);
  }
  return;
}

Assistant:

void expand_if_needed_(uint64_t& node_id) {
        if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
            if (!hash_trie_.needs_to_expand()) {
                return;
            }
            auto node_map = hash_trie_.expand();
            node_id = node_map[node_id];
            label_store_.expand(node_map);
        }
    }